

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

void __thiscall QRegularExpressionPrivate::getPatternInfo(QRegularExpressionPrivate *this)

{
  int iVar1;
  long in_RDI;
  long in_FS_OFFSET;
  uint hasJOptionChanged;
  uint patternNewlineSetting;
  bool local_41;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pcre2_pattern_info_16(*(undefined8 *)(in_RDI + 0x28),4,in_RDI + 0x40);
  local_c = -0x55555556;
  iVar1 = pcre2_pattern_info_16(*(undefined8 *)(in_RDI + 0x28),0x14,&local_c);
  if (iVar1 != 0) {
    pcre2_config_16(5,&local_c);
  }
  local_41 = true;
  if ((local_c != 3) && (local_41 = true, local_c != 4)) {
    local_41 = local_c == 5;
  }
  *(bool *)(in_RDI + 0x44) = local_41;
  local_10 = -0x55555556;
  pcre2_pattern_info_16(*(undefined8 *)(in_RDI + 0x28),9,&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRegularExpressionPrivate::getPatternInfo()
{
    Q_ASSERT(compiledPattern);

    pcre2_pattern_info_16(compiledPattern, PCRE2_INFO_CAPTURECOUNT, &capturingCount);

    // detect the settings for the newline
    unsigned int patternNewlineSetting;
    if (pcre2_pattern_info_16(compiledPattern, PCRE2_INFO_NEWLINE, &patternNewlineSetting) != 0) {
        // no option was specified in the regexp, grab PCRE build defaults
        pcre2_config_16(PCRE2_CONFIG_NEWLINE, &patternNewlineSetting);
    }

    usingCrLfNewlines = (patternNewlineSetting == PCRE2_NEWLINE_CRLF) ||
            (patternNewlineSetting == PCRE2_NEWLINE_ANY) ||
            (patternNewlineSetting == PCRE2_NEWLINE_ANYCRLF);

    unsigned int hasJOptionChanged;
    pcre2_pattern_info_16(compiledPattern, PCRE2_INFO_JCHANGED, &hasJOptionChanged);
    if (Q_UNLIKELY(hasJOptionChanged)) {
        qWarning("QRegularExpressionPrivate::getPatternInfo(): the pattern '%ls'\n    is using the (?J) option; duplicate capturing group names are not supported by Qt",
                 qUtf16Printable(pattern));
    }
}